

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path.c
# Opt level: O0

size_t portability_path_canonical(char *path,size_t path_size,char *canonical,size_t canonical_size)

{
  bool bVar1;
  char cVar2;
  long lVar3;
  bool bVar4;
  size_t next;
  size_t next_second;
  size_t next_first;
  char separator;
  int separator_found;
  size_t size;
  size_t iterator;
  size_t canonical_size_local;
  char *canonical_local;
  size_t path_size_local;
  char *path_local;
  size_t local_8;
  
  if ((path == (char *)0x0) || (canonical == (char *)0x0)) {
    local_8 = 0;
  }
  else {
    size = 0;
    bVar1 = true;
    separator = '/';
    for (iterator = 0; iterator < path_size; iterator = iterator + 1) {
      if (path[iterator] == '/') {
        bVar1 = false;
        separator = path[iterator];
        break;
      }
    }
    for (iterator = 0; path[iterator] == '.' && size < canonical_size; iterator = iterator + 1) {
      if (path[iterator + 1] == '/') {
        iterator = iterator + 1;
        size = 0;
      }
      else if ((path[iterator + 1] == '.') && (path[iterator + 2] == '/')) {
        iterator = iterator + 2;
        size = 0;
      }
      else {
        canonical[size] = path[iterator];
        size = size + 1;
      }
    }
    for (; iterator < path_size && size < canonical_size; iterator = iterator + 1) {
      if (path[iterator] == '.') {
        lVar3 = iterator + 1;
        if (path[lVar3] == '.') {
          if (size < 3) {
            size = 0;
            if (path[iterator + 3] == '.') {
              iterator = iterator + 2;
            }
            else {
              iterator = iterator + 3;
            }
          }
          else {
            size = size - 2;
            while( true ) {
              bVar4 = false;
              if (size != 0) {
                bVar4 = canonical[size] != '/';
              }
              if (!bVar4) break;
              size = size - 1;
            }
            iterator = iterator + 2;
          }
        }
        else if (path[lVar3] == '/') {
          if (path[iterator + 2] == '.') {
            iterator = iterator + 1;
            if (size != 0) {
              size = size - 1;
            }
          }
          else {
            iterator = iterator + 2;
          }
        }
        else if (path[lVar3] == '\0') {
          if (1 < size) {
            size = size - 1;
          }
          iterator = iterator + 1;
        }
      }
      if ((path[iterator] != '/') || (cVar2 = separator, bVar1)) {
        cVar2 = path[iterator];
      }
      canonical[size] = cVar2;
      size = size + 1;
    }
    local_8 = size;
  }
  return local_8;
}

Assistant:

size_t portability_path_canonical(const char *path, size_t path_size, char *canonical, size_t canonical_size)
{
	if (path == NULL || canonical == NULL)
	{
		return 0;
	}

	size_t iterator, size = 0;
	int separator_found = 1;
	char separator = PORTABILITY_PATH_SEPARATOR_C; /* Use current platform style as default */

	/* Standarize the separators */
	for (iterator = 0; iterator < path_size; ++iterator)
	{
		if (PORTABILITY_PATH_SEPARATOR(path[iterator]))
		{
			separator_found = 0;
			separator = path[iterator];
			break;
		}
	}

	/* Remove first dots */
	for (iterator = 0; path[iterator] == '.' && size < canonical_size; ++iterator)
	{
		size_t next_first = iterator + 1;
		size_t next_second = iterator + 2;

		if (PORTABILITY_PATH_SEPARATOR(path[next_first]))
		{
			++iterator;
			size = 0;
		}
		else if (path[next_first] == '.' && PORTABILITY_PATH_SEPARATOR(path[next_second]))
		{
			iterator += 2;
			size = 0;
		}
		else
		{
			canonical[size++] = path[iterator];
		}
	}

	/* Canonicalize the path */
	for (/* void */; iterator < path_size && size < canonical_size; ++iterator)
	{
		if (path[iterator] == '.')
		{
			size_t next = iterator + 1;

			if (path[next] == '.')
			{
				if (size > 2)
				{
					size -= 2;

					while (size > 0 && !PORTABILITY_PATH_SEPARATOR(canonical[size]))
					{
						--size;
					}

					iterator += 2;
				}
				else
				{
					size = 0;

					if (path[iterator + 3] == '.')
					{
						iterator += 2;
					}
					else
					{
						iterator += 3;
					}
				}
			}
			else if (PORTABILITY_PATH_SEPARATOR(path[next]))
			{
				if (path[next + 1] == '.')
				{
					iterator += 1;

					if (size > 0)
					{
						--size;
					}
				}
				else
				{
					iterator += 2;
				}
			}
			else if (path[next] == '\0')
			{
				if (size > 1)
				{
					--size;
				}

				++iterator;
			}
		}

		/* Store the correct separator */
		canonical[size++] = PORTABILITY_PATH_SEPARATOR(path[iterator]) && separator_found == 0 ? separator : path[iterator];
	}

	return size;
}